

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux.c
# Opt level: O3

int uv_fs_event_start(uv_fs_event_t *handle,uv_fs_event_cb cb,char *path,uint flags)

{
  uint *puVar1;
  int iVar2;
  uint uVar3;
  uv_loop_t *loop;
  long lVar4;
  uv__queue *puVar5;
  long *plVar6;
  int iVar7;
  size_t sVar8;
  long *plVar9;
  void **ppvVar10;
  int *piVar11;
  void **ppvVar12;
  long *plVar13;
  long *plVar14;
  undefined8 *puVar15;
  undefined8 *puVar16;
  long *plVar17;
  long *plVar18;
  undefined8 *puVar19;
  
  iVar7 = -0x16;
  if ((handle->flags & 4) == 0) {
    loop = handle->loop;
    if (loop->inotify_fd == -1) {
      iVar7 = inotify_init1(0x80800);
      if (iVar7 < 0) {
        piVar11 = __errno_location();
        if (*piVar11 != 0) {
          return -*piVar11;
        }
      }
      else {
        loop->inotify_fd = iVar7;
        uv__io_init(&loop->inotify_read_watcher,uv__inotify_read,iVar7);
        uv__io_start(loop,&loop->inotify_read_watcher,1);
      }
    }
    iVar7 = inotify_add_watch(loop->inotify_fd,path,0xfc6);
    if (iVar7 == -1) {
      piVar11 = __errno_location();
      iVar7 = -*piVar11;
    }
    else {
      for (plVar9 = (long *)loop->inotify_watchers; plVar9 != (long *)0x0; plVar9 = (long *)*plVar9)
      {
        if ((int)plVar9[8] <= iVar7) {
          if (iVar7 <= (int)plVar9[8]) goto LAB_0011de5a;
          plVar9 = plVar9 + 1;
        }
      }
      sVar8 = strlen(path);
      plVar9 = (long *)uv__malloc(sVar8 + 0x49);
      if (plVar9 == (long *)0x0) {
        iVar7 = -0xc;
      }
      else {
        ppvVar10 = &loop->inotify_watchers;
        *(int *)(plVar9 + 8) = iVar7;
        memcpy(plVar9 + 9,path,sVar8 + 1);
        plVar9[7] = (long)(plVar9 + 9);
        plVar9[4] = (long)(plVar9 + 4);
        plVar9[5] = (long)(plVar9 + 4);
        *(undefined4 *)(plVar9 + 6) = 0;
        puVar19 = (undefined8 *)*ppvVar10;
        if ((undefined8 *)*ppvVar10 == (undefined8 *)0x0) {
          *plVar9 = 0;
          plVar9[1] = 0;
          plVar9[2] = 0;
          *(undefined4 *)(plVar9 + 3) = 1;
          ppvVar12 = ppvVar10;
        }
        else {
          do {
            puVar15 = puVar19;
            iVar2 = *(int *)(puVar15 + 8);
            puVar16 = puVar15;
            if (iVar2 <= iVar7) {
              if (iVar7 <= iVar2) goto LAB_0011de5a;
              puVar16 = puVar15 + 1;
            }
            puVar19 = (undefined8 *)*puVar16;
          } while ((undefined8 *)*puVar16 != (undefined8 *)0x0);
          plVar9[2] = (long)puVar15;
          *plVar9 = 0;
          plVar9[1] = 0;
          *(undefined4 *)(plVar9 + 3) = 1;
          ppvVar12 = (void **)(puVar15 + (iVar2 <= iVar7));
        }
        *ppvVar12 = plVar9;
        plVar17 = (long *)plVar9[2];
        plVar6 = plVar9;
        while ((plVar17 != (long *)0x0 && ((int)plVar17[3] == 1))) {
          plVar14 = (long *)plVar17[2];
          plVar18 = (long *)*plVar14;
          plVar13 = plVar6;
          if (plVar17 == plVar18) {
            plVar18 = (long *)plVar14[1];
            if ((plVar18 != (long *)0x0) && ((int)plVar18[3] == 1)) goto LAB_0011dcf3;
            plVar18 = (long *)plVar17[1];
            if (plVar18 == plVar6) {
              lVar4 = *plVar18;
              plVar17[1] = lVar4;
              if (lVar4 == 0) {
                plVar18[2] = (long)plVar14;
                puVar19 = (undefined8 *)plVar17[2];
LAB_0011dddb:
                ppvVar12 = (void **)(puVar19 + (plVar17 != (long *)*puVar19));
              }
              else {
                *(long **)(lVar4 + 0x10) = plVar17;
                puVar19 = (undefined8 *)plVar17[2];
                plVar18[2] = (long)puVar19;
                ppvVar12 = ppvVar10;
                if (puVar19 != (undefined8 *)0x0) goto LAB_0011dddb;
              }
              *ppvVar12 = plVar18;
              *plVar18 = (long)plVar17;
              plVar17[2] = (long)plVar18;
              plVar13 = plVar17;
              plVar17 = plVar6;
            }
            *(undefined4 *)(plVar17 + 3) = 0;
            *(undefined4 *)(plVar14 + 3) = 1;
            plVar17 = (long *)*plVar14;
            lVar4 = plVar17[1];
            *plVar14 = lVar4;
            if (lVar4 != 0) {
              *(long **)(lVar4 + 0x10) = plVar14;
            }
            puVar19 = (undefined8 *)plVar14[2];
            plVar17[2] = (long)puVar19;
            ppvVar12 = ppvVar10;
            if (puVar19 != (undefined8 *)0x0) {
              ppvVar12 = (void **)(puVar19 + (plVar14 != (long *)*puVar19));
            }
            *ppvVar12 = plVar17;
            plVar17[1] = (long)plVar14;
LAB_0011de3c:
            plVar14[2] = (long)plVar17;
            plVar14 = plVar13;
          }
          else {
            if ((plVar18 == (long *)0x0) || ((int)plVar18[3] != 1)) {
              plVar18 = (long *)*plVar17;
              if (plVar18 == plVar6) {
                lVar4 = plVar18[1];
                *plVar17 = lVar4;
                if (lVar4 == 0) {
                  plVar18[2] = (long)plVar14;
                  puVar19 = (undefined8 *)plVar17[2];
LAB_0011dd6f:
                  ppvVar12 = (void **)(puVar19 + (plVar17 != (long *)*puVar19));
                }
                else {
                  *(long **)(lVar4 + 0x10) = plVar17;
                  puVar19 = (undefined8 *)plVar17[2];
                  plVar18[2] = (long)puVar19;
                  ppvVar12 = ppvVar10;
                  if (puVar19 != (undefined8 *)0x0) goto LAB_0011dd6f;
                }
                *ppvVar12 = plVar18;
                plVar18[1] = (long)plVar17;
                plVar17[2] = (long)plVar18;
                plVar13 = plVar17;
                plVar17 = plVar6;
              }
              *(undefined4 *)(plVar17 + 3) = 0;
              *(undefined4 *)(plVar14 + 3) = 1;
              plVar17 = (long *)plVar14[1];
              lVar4 = *plVar17;
              plVar14[1] = lVar4;
              if (lVar4 != 0) {
                *(long **)(lVar4 + 0x10) = plVar14;
              }
              puVar19 = (undefined8 *)plVar14[2];
              plVar17[2] = (long)puVar19;
              ppvVar12 = ppvVar10;
              if (puVar19 != (undefined8 *)0x0) {
                ppvVar12 = (void **)(puVar19 + (plVar14 != (long *)*puVar19));
              }
              *ppvVar12 = plVar17;
              *plVar17 = (long)plVar14;
              goto LAB_0011de3c;
            }
LAB_0011dcf3:
            *(undefined4 *)(plVar18 + 3) = 0;
            *(undefined4 *)(plVar17 + 3) = 0;
            *(undefined4 *)(plVar14 + 3) = 1;
          }
          plVar6 = plVar14;
          plVar17 = (long *)plVar14[2];
        }
        *(undefined4 *)((long)*ppvVar10 + 0x18) = 0;
LAB_0011de5a:
        uVar3 = handle->flags;
        if (((uVar3 & 4) == 0) && (handle->flags = uVar3 | 4, (uVar3 & 8) != 0)) {
          puVar1 = &handle->loop->active_handles;
          *puVar1 = *puVar1 + 1;
        }
        (handle->watchers).next = (uv__queue *)(plVar9 + 4);
        puVar5 = (uv__queue *)plVar9[5];
        (handle->watchers).prev = puVar5;
        puVar5->next = &handle->watchers;
        plVar9[5] = (long)&handle->watchers;
        handle->path = (char *)plVar9[7];
        handle->cb = cb;
        handle->wd = iVar7;
        iVar7 = 0;
      }
    }
  }
  return iVar7;
}

Assistant:

int uv_fs_event_start(uv_fs_event_t* handle,
                      uv_fs_event_cb cb,
                      const char* path,
                      unsigned int flags) {
  struct watcher_list* w;
  uv_loop_t* loop;
  size_t len;
  int events;
  int err;
  int wd;

  if (uv__is_active(handle))
    return UV_EINVAL;

  loop = handle->loop;

  err = init_inotify(loop);
  if (err)
    return err;

  events = IN_ATTRIB
         | IN_CREATE
         | IN_MODIFY
         | IN_DELETE
         | IN_DELETE_SELF
         | IN_MOVE_SELF
         | IN_MOVED_FROM
         | IN_MOVED_TO;

  wd = inotify_add_watch(loop->inotify_fd, path, events);
  if (wd == -1)
    return UV__ERR(errno);

  w = find_watcher(loop, wd);
  if (w)
    goto no_insert;

  len = strlen(path) + 1;
  w = uv__malloc(sizeof(*w) + len);
  if (w == NULL)
    return UV_ENOMEM;

  w->wd = wd;
  w->path = memcpy(w + 1, path, len);
  uv__queue_init(&w->watchers);
  w->iterating = 0;
  RB_INSERT(watcher_root, uv__inotify_watchers(loop), w);

no_insert:
  uv__handle_start(handle);
  uv__queue_insert_tail(&w->watchers, &handle->watchers);
  handle->path = w->path;
  handle->cb = cb;
  handle->wd = wd;

  return 0;
}